

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O2

void easm_del_insn(easm_insn *insn)

{
  long lVar1;
  
  if (insn != (easm_insn *)0x0) {
    for (lVar1 = 0; lVar1 < insn->subinsnsnum; lVar1 = lVar1 + 1) {
      easm_del_subinsn(insn->subinsns[lVar1]);
    }
    free(insn->subinsns);
    free(insn);
    return;
  }
  return;
}

Assistant:

void easm_del_insn(struct easm_insn *insn) {
	if (!insn) return;
	int i;
	for (i = 0; i < insn->subinsnsnum; i++)
		easm_del_subinsn(insn->subinsns[i]);
	free(insn->subinsns);
	free(insn);
}